

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::UnitTestImpl::ListTestsMatchingFilter(UnitTestImpl *this)

{
  size_type *psVar1;
  TestSuite *pTVar2;
  TestInfo *pTVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  UnitTestImpl *pUVar5;
  int iVar6;
  pointer ppTVar7;
  FILE *__stream;
  pointer ppTVar8;
  bool bVar9;
  pointer ppTVar10;
  _Alloc_hider _Var11;
  ulong uVar12;
  undefined1 local_230 [8];
  stringstream stream;
  ostream local_220 [112];
  ios_base local_1b0 [264];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  pointer local_88;
  UnitTestImpl *local_80;
  char *local_78 [2];
  char local_68 [16];
  JsonUnitTestResultPrinter local_58;
  
  ppTVar10 = (this->test_suites_).
             super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  local_88 = (this->test_suites_).
             super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  local_80 = this;
  if (ppTVar10 != local_88) {
    do {
      pTVar2 = *ppTVar10;
      ppTVar7 = (pTVar2->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppTVar8 = (pTVar2->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppTVar8 != ppTVar7) {
        bVar9 = false;
        uVar12 = 0;
        do {
          pTVar3 = ppTVar7[uVar12];
          if (pTVar3->matches_filter_ == true) {
            if (!bVar9) {
              printf("%s.",(pTVar2->name_)._M_dataplus._M_p);
              pbVar4 = (pTVar2->type_param_)._M_t.
                       super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              if ((pbVar4 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0) && ((pbVar4->_M_dataplus)._M_p != (pointer)0x0)) {
                iVar6 = 0x1ccfc2;
                printf("  # %s = ");
                pbVar4 = (pTVar2->type_param_)._M_t.
                         super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
                if (pbVar4 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                  _Var11._M_p = (char *)0x0;
                }
                else {
                  _Var11._M_p = (pbVar4->_M_dataplus)._M_p;
                }
                PrintOnOneLine(_Var11._M_p,iVar6);
              }
              putchar(10);
            }
            printf("  %s",(pTVar3->name_)._M_dataplus._M_p);
            pbVar4 = (pTVar3->value_param_)._M_t.
                     super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            if ((pbVar4 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
               && ((pbVar4->_M_dataplus)._M_p != (pointer)0x0)) {
              iVar6 = 0x1cd028;
              printf("  # %s = ");
              pbVar4 = (pTVar3->value_param_)._M_t.
                       super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              if (pbVar4 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 ) {
                _Var11._M_p = (char *)0x0;
              }
              else {
                _Var11._M_p = (pbVar4->_M_dataplus)._M_p;
              }
              PrintOnOneLine(_Var11._M_p,iVar6);
            }
            putchar(10);
            ppTVar7 = (pTVar2->test_info_list_).
                      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            ppTVar8 = (pTVar2->test_info_list_).
                      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            bVar9 = true;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < (ulong)((long)ppTVar8 - (long)ppTVar7 >> 3));
      }
      ppTVar10 = ppTVar10 + 1;
    } while (ppTVar10 != local_88);
  }
  fflush(_stdout);
  UnitTestOptions::GetOutputFormat_abi_cxx11_();
  iVar6 = std::__cxx11::string::compare((char *)local_a8);
  if ((iVar6 != 0) && (iVar6 = std::__cxx11::string::compare((char *)local_a8), iVar6 != 0))
  goto LAB_001b251a;
  UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
  std::__cxx11::string::string
            ((string *)local_230,
             (char *)local_58.super_EmptyTestEventListener.super_TestEventListener.
                     _vptr_TestEventListener,(allocator *)local_78);
  __stream = (FILE *)OpenFileForWriting((string *)local_230);
  pUVar5 = local_80;
  if (local_230 != (undefined1  [8])local_220) {
    operator_delete((void *)local_230);
  }
  psVar1 = &local_58.output_file_._M_string_length;
  if (local_58.super_EmptyTestEventListener.super_TestEventListener._vptr_TestEventListener !=
      (TestEventListener)psVar1) {
    operator_delete((void *)local_58.super_EmptyTestEventListener.super_TestEventListener.
                            _vptr_TestEventListener);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_230);
  iVar6 = std::__cxx11::string::compare((char *)local_a8);
  if (iVar6 == 0) {
    UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
    XmlUnitTestResultPrinter::XmlUnitTestResultPrinter
              ((XmlUnitTestResultPrinter *)&local_58,local_78[0]);
    XmlUnitTestResultPrinter::PrintXmlTestsList(local_220,&pUVar5->test_suites_);
    local_58.super_EmptyTestEventListener.super_TestEventListener._vptr_TestEventListener =
         (TestEventListener)&PTR__XmlUnitTestResultPrinter_001f8150;
LAB_001b24a1:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.output_file_._M_dataplus._M_p != &local_58.output_file_.field_2) {
      operator_delete(local_58.output_file_._M_dataplus._M_p);
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0]);
    }
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)local_a8);
    if (iVar6 == 0) {
      UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
      JsonUnitTestResultPrinter::JsonUnitTestResultPrinter(&local_58,local_78[0]);
      JsonUnitTestResultPrinter::PrintJsonTestList(local_220,&pUVar5->test_suites_);
      local_58.super_EmptyTestEventListener.super_TestEventListener._vptr_TestEventListener =
           (TestEventListener)&PTR__JsonUnitTestResultPrinter_001f81e8;
      goto LAB_001b24a1;
    }
  }
  StringStreamToString((string *)&local_58,(stringstream *)local_230);
  fputs((char *)local_58.super_EmptyTestEventListener.super_TestEventListener.
                _vptr_TestEventListener,__stream);
  if (local_58.super_EmptyTestEventListener.super_TestEventListener._vptr_TestEventListener !=
      (TestEventListener)psVar1) {
    operator_delete((void *)local_58.super_EmptyTestEventListener.super_TestEventListener.
                            _vptr_TestEventListener);
  }
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_230);
  std::ios_base::~ios_base(local_1b0);
LAB_001b251a:
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0]);
  }
  return;
}

Assistant:

void UnitTestImpl::ListTestsMatchingFilter() {
  // Print at most this many characters for each type/value parameter.
  const int kMaxParamLength = 250;

  for (auto* test_suite : test_suites_) {
    bool printed_test_suite_name = false;

    for (size_t j = 0; j < test_suite->test_info_list().size(); j++) {
      const TestInfo* const test_info = test_suite->test_info_list()[j];
      if (test_info->matches_filter_) {
        if (!printed_test_suite_name) {
          printed_test_suite_name = true;
          printf("%s.", test_suite->name());
          if (test_suite->type_param() != nullptr) {
            printf("  # %s = ", kTypeParamLabel);
            // We print the type parameter on a single line to make
            // the output easy to parse by a program.
            PrintOnOneLine(test_suite->type_param(), kMaxParamLength);
          }
          printf("\n");
        }
        printf("  %s", test_info->name());
        if (test_info->value_param() != nullptr) {
          printf("  # %s = ", kValueParamLabel);
          // We print the value parameter on a single line to make the
          // output easy to parse by a program.
          PrintOnOneLine(test_info->value_param(), kMaxParamLength);
        }
        printf("\n");
      }
    }
  }
  fflush(stdout);
  const std::string& output_format = UnitTestOptions::GetOutputFormat();
  if (output_format == "xml" || output_format == "json") {
    FILE* fileout = OpenFileForWriting(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str());
    std::stringstream stream;
    if (output_format == "xml") {
      XmlUnitTestResultPrinter(
          UnitTestOptions::GetAbsolutePathToOutputFile().c_str())
          .PrintXmlTestsList(&stream, test_suites_);
    } else if (output_format == "json") {
      JsonUnitTestResultPrinter(
          UnitTestOptions::GetAbsolutePathToOutputFile().c_str())
          .PrintJsonTestList(&stream, test_suites_);
    }
    fprintf(fileout, "%s", StringStreamToString(&stream).c_str());
    fclose(fileout);
  }
}